

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_run_container_andnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *__dest;
  rle16_t *prVar3;
  int iVar4;
  bitset_container_t *bitset;
  ulong uVar5;
  array_container_t *paVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  
  bitset = bitset_container_create();
  bitset->cardinality = src_1->cardinality;
  __dest = bitset->words;
  memcpy(__dest,src_1->words,0x2000);
  iVar4 = src_2->n_runs;
  if (0 < (long)iVar4) {
    prVar3 = src_2->runs;
    lVar8 = 0;
    do {
      uVar1 = prVar3[lVar8].value;
      uVar2 = prVar3[lVar8].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar10 = (uint)uVar2 + (uint)uVar1;
        uVar7 = (uint)(uVar1 >> 6);
        uVar5 = -1L << ((byte)uVar1 & 0x3f);
        uVar11 = uVar10 >> 6;
        bVar9 = (byte)uVar10;
        if (uVar11 - uVar7 == 0) {
          bVar9 = ~bVar9;
          uVar5 = (uVar5 << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
          uVar11 = uVar7;
        }
        else {
          __dest[uVar7] = __dest[uVar7] & ~uVar5;
          if (uVar7 + 1 < uVar11) {
            memset(__dest + (ulong)(uVar1 >> 6) + 1,0,(ulong)((uVar11 - uVar7) - 2) * 8 + 8);
          }
          uVar5 = 0xffffffffffffffff >> (~bVar9 & 0x3f);
        }
        __dest[uVar11] = __dest[uVar11] & ~uVar5;
      }
      lVar8 = lVar8 + 1;
    } while (iVar4 != lVar8);
  }
  iVar4 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar4;
  if (iVar4 < 0x1001) {
    paVar6 = array_container_from_bitset(bitset);
    *dst = paVar6;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar4;
}

Assistant:

bool bitset_run_container_andnot(
    const bitset_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    // follows Java implementation
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_1, result);
    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(result->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}